

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_bitset_container_intersect(run_container_t *src_1,bitset_container_t *src_2)

{
  ushort uVar1;
  rle16_t *prVar2;
  uint64_t *puVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  
  prVar2 = src_1->runs;
  uVar5 = src_1->n_runs;
  uVar6 = (ulong)uVar5;
  if (((uVar6 == 1) && (prVar2->value == 0)) && (prVar2->length == 0xffff)) {
    if (src_2->cardinality == -1) {
      if (*src_2->words == 0) {
        uVar6 = 0;
        do {
          uVar7 = uVar6;
          if (uVar7 == 0x3ff) break;
          uVar6 = uVar7 + 1;
        } while (src_2->words[uVar7 + 1] == 0);
        bVar10 = 0x3fe < uVar7;
      }
      else {
        bVar10 = false;
      }
    }
    else {
      bVar10 = src_2->cardinality == 0;
    }
    bVar10 = (bool)(bVar10 ^ 1);
  }
  else {
    bVar10 = 0 < (int)uVar5;
    if (0 < (int)uVar5) {
      puVar3 = src_2->words;
      uVar7 = 0;
      do {
        uVar1 = prVar2[uVar7].value;
        uVar8 = (ulong)(uint)(uVar1 >> 6);
        uVar5 = (uint)uVar1 + (uint)prVar2[uVar7].length;
        uVar9 = uVar5 >> 6;
        if (uVar1 >> 6 == uVar9) {
          uVar8 = puVar3[uVar8] &
                  (0xffffffffffffffffU >> (0x3fU - (char)prVar2[uVar7].length & 0x3f)) <<
                  ((byte)uVar1 & 0x3f);
        }
        else {
          if (puVar3[uVar8] >> ((byte)uVar1 & 0x3f) != 0) {
            return bVar10;
          }
          while (uVar8 = uVar8 + 1, uVar8 < uVar9) {
            if (puVar3[uVar8] != 0) {
              return bVar10;
            }
          }
          bVar4 = ~(byte)uVar5;
          uVar8 = (puVar3[uVar9] << (bVar4 & 0x3f)) >> (bVar4 & 0x3f);
        }
        if (uVar8 != 0) {
          return bVar10;
        }
        uVar7 = uVar7 + 1;
        bVar10 = uVar7 < uVar6;
      } while (uVar7 != uVar6);
    }
  }
  return bVar10;
}

Assistant:

bool run_bitset_container_intersect(const run_container_t *src_1,
                                       const bitset_container_t *src_2) {
	   if( run_container_is_full(src_1) ) {
		   return !bitset_container_empty(src_2);
	   }
       for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
           rle16_t rle = src_1->runs[rlepos];
           if(!bitset_lenrange_empty(src_2->words, rle.value,rle.length)) return true;
       }
       return false;
}